

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O3

SRes SzReadAndDecodePackedStreams
               (ILookInStream *inStream,CSzData *sd,CBuf *tempBufs,UInt32 numFoldersMax,
               UInt64 baseOffset,CSzAr *p,ISzAlloc *allocTemp)

{
  SRes SVar1;
  int iVar2;
  CBuf *pCVar3;
  ulong uVar4;
  size_t *psVar5;
  UInt64 local_70;
  CSubStreamInfo ssi;
  
  SVar1 = SzReadStreamsInfo(p,sd,numFoldersMax,(CBuf *)0x0,0,&local_70,&ssi,allocTemp);
  if (SVar1 == 0) {
    if (p->NumFolders == 0) {
      SVar1 = 0x10;
    }
    else {
      uVar4 = 0;
      pCVar3 = tempBufs;
      do {
        Buf_Init(pCVar3);
        uVar4 = uVar4 + 1;
        pCVar3 = pCVar3 + 1;
      } while (uVar4 < p->NumFolders);
      if (p->NumFolders != 0) {
        uVar4 = 0;
        pCVar3 = tempBufs;
        do {
          iVar2 = Buf_Create(pCVar3,p->CoderUnpackSizes
                                    [(uint)p->FoToMainUnpackSizeIndex[uVar4] +
                                     p->FoToCoderUnpackSizes[uVar4]],allocTemp);
          if (iVar2 == 0) {
            return 2;
          }
          uVar4 = uVar4 + 1;
          pCVar3 = pCVar3 + 1;
        } while (uVar4 < p->NumFolders);
        if (p->NumFolders != 0) {
          psVar5 = &tempBufs->size;
          uVar4 = 0;
          while( true ) {
            SVar1 = LookInStream_SeekTo(inStream,baseOffset + local_70);
            if (SVar1 != 0) {
              return SVar1;
            }
            SVar1 = SzAr_DecodeFolder(p,(UInt32)uVar4,inStream,baseOffset + local_70,
                                      ((CBuf *)(psVar5 + -1))->data,*psVar5,allocTemp);
            if (SVar1 != 0) break;
            uVar4 = uVar4 + 1;
            psVar5 = psVar5 + 2;
            if (p->NumFolders <= uVar4) {
              return 0;
            }
          }
          return SVar1;
        }
      }
      SVar1 = 0;
    }
  }
  return SVar1;
}

Assistant:

static SRes SzReadAndDecodePackedStreams(
    ILookInStream *inStream,
    CSzData *sd,
    CBuf *tempBufs,
    UInt32 numFoldersMax,
    UInt64 baseOffset,
    CSzAr *p,
    ISzAlloc *allocTemp)
{
  UInt64 dataStartPos;
  UInt32 fo;
  CSubStreamInfo ssi;

  RINOK(SzReadStreamsInfo(p, sd, numFoldersMax, NULL, 0, &dataStartPos, &ssi, allocTemp));
  
  dataStartPos += baseOffset;
  if (p->NumFolders == 0)
    return SZ_ERROR_ARCHIVE;
 
  for (fo = 0; fo < p->NumFolders; fo++)
    Buf_Init(tempBufs + fo);
  
  for (fo = 0; fo < p->NumFolders; fo++)
  {
    CBuf *tempBuf = tempBufs + fo;
    UInt64 unpackSize = SzAr_GetFolderUnpackSize(p, fo);
    if ((size_t)unpackSize != unpackSize)
      return SZ_ERROR_MEM;
    if (!Buf_Create(tempBuf, (size_t)unpackSize, allocTemp))
      return SZ_ERROR_MEM;
  }
  
  for (fo = 0; fo < p->NumFolders; fo++)
  {
    const CBuf *tempBuf = tempBufs + fo;
    RINOK(LookInStream_SeekTo(inStream, dataStartPos));
    RINOK(SzAr_DecodeFolder(p, fo, inStream, dataStartPos, tempBuf->data, tempBuf->size, allocTemp));
  }
  
  return SZ_OK;
}